

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4plus.hpp
# Opt level: O0

basic_istream<wchar_t,_std::char_traits<wchar_t>_> *
trng::operator>>(basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in,status_type *S)

{
  bool bVar1;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var2;
  uint uVar3;
  ios_base *this;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  void *in_RSI;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_RDI;
  uint i;
  fmtflags flags;
  status_type S_new;
  delim_c *in_stack_ffffffffffffdfa8;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *in_stack_ffffffffffffdfb0;
  uint local_2024;
  status_type local_2018;
  void *local_10;
  basic_istream<wchar_t,_std::char_traits<wchar_t>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>::status_type::status_type(&local_2018);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = (ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18));
  _Var2 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var2 = Catch::clara::std::operator|(_Var2,_S_left);
  Catch::clara::std::ios_base::flags(this,_Var2);
  utility::delim('\0');
  pbVar4 = utility::operator>>(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
  std::wistream::operator>>((wistream *)pbVar4,&local_2018.index);
  for (local_2024 = 0;
      uVar3 = lagfib4plus<unsigned_long,_168U,_205U,_242U,_521U>::status_type::size(),
      local_2024 < uVar3; local_2024 = local_2024 + 1) {
    utility::delim('\0');
    pbVar4 = utility::operator>>(in_stack_ffffffffffffdfb0,in_stack_ffffffffffffdfa8);
    std::wistream::operator>>((wistream *)pbVar4,local_2018.r + local_2024);
  }
  pbVar4 = local_8;
  utility::delim('\0');
  utility::operator>>(pbVar4,in_stack_ffffffffffffdfa8);
  bVar1 = std::wios::operator_cast_to_bool((wios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar1) {
    memcpy(local_10,&local_2018,0x2004);
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, status_type &S) {
        status_type S_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> S_new.index;
        for (unsigned int i{0}; i < S.size(); ++i)
          in >> utility::delim(' ') >> S_new.r[i];
        in >> utility::delim(')');
        if (in)
          S = S_new;
        in.flags(flags);
        return in;
      }